

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void * __thiscall ctemplate::BaseArena::GetMemory(BaseArena *this,size_t size,int align)

{
  int align_local;
  size_t size_local;
  BaseArena *this_local;
  
  if (this->remaining_ <= this->block_size_) {
    if (((size == 0) || (this->remaining_ <= size)) || (align != 1)) {
      this_local = (BaseArena *)GetMemoryFallback(this,size,align);
    }
    else {
      this->last_alloc_ = this->freestart_;
      this->freestart_ = this->freestart_ + size;
      this->remaining_ = this->remaining_ - size;
      this_local = (BaseArena *)this->last_alloc_;
    }
    return this_local;
  }
  __assert_fail("remaining_ <= block_size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.h"
                ,0x17a,"void *ctemplate::BaseArena::GetMemory(const size_t, const int)");
}

Assistant:

void* GetMemory(const size_t size, const int align) {
    assert(remaining_ <= block_size_);          // an invariant
    if ( size > 0 && size < remaining_ && align == 1 ) {       // common case
      last_alloc_ = freestart_;
      freestart_ += size;
      remaining_ -= size;
      return reinterpret_cast<void*>(last_alloc_);
    }
    return GetMemoryFallback(size, align);
  }